

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O2

int is_null(char *p,size_t l)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (l == sVar1) {
      return 1;
    }
    if (p[sVar1] != '\0') break;
    sVar1 = sVar1 + 1;
  }
  return 0;
}

Assistant:

static int
is_null(const char *p, size_t l)
{
	while (l > 0) {
		if (*p != '\0')
			return (0);
		--l;
		++p;
	}
	return (1);
}